

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char cVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong unaff_RBP;
  NodeRef *pNVar16;
  NodeRef *pNVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  int iVar23;
  int iVar48;
  int iVar49;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar50;
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_3;
  vint4 bi_1;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar53 [16];
  vint4 ai;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 1.0000004)));
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  pNVar17 = stack + 1;
  do {
    pNVar16 = pNVar17;
    if (pNVar16 == stack) break;
    pNVar17 = pNVar16 + -1;
    sVar20 = pNVar16[-1].ptr;
    do {
      if ((sVar20 & 8) == 0) {
        fVar4 = *(float *)(ray + k * 4 + 0x70);
        uVar13 = (uint)sVar20 & 7;
        uVar12 = sVar20 & 0xfffffffffffffff0;
        if (uVar13 == 3) {
          auVar35 = *(undefined1 (*) [16])(uVar12 + 0x80);
          auVar36 = *(undefined1 (*) [16])(uVar12 + 0x90);
          auVar37 = *(undefined1 (*) [16])(uVar12 + 0xa0);
          fVar5 = 1.0 - fVar4;
          auVar38._0_4_ = fVar4 * *(float *)(uVar12 + 0xe0);
          auVar38._4_4_ = fVar4 * *(float *)(uVar12 + 0xe4);
          auVar38._8_4_ = fVar4 * *(float *)(uVar12 + 0xe8);
          auVar38._12_4_ = fVar4 * *(float *)(uVar12 + 0xec);
          auVar57._4_4_ = fVar5;
          auVar57._0_4_ = fVar5;
          auVar57._8_4_ = fVar5;
          auVar57._12_4_ = fVar5;
          auVar47._0_4_ = fVar4 * *(float *)(uVar12 + 0xf0);
          auVar47._4_4_ = fVar4 * *(float *)(uVar12 + 0xf4);
          auVar47._8_4_ = fVar4 * *(float *)(uVar12 + 0xf8);
          auVar47._12_4_ = fVar4 * *(float *)(uVar12 + 0xfc);
          auVar55._0_4_ = fVar4 * *(float *)(uVar12 + 0x100);
          auVar55._4_4_ = fVar4 * *(float *)(uVar12 + 0x104);
          auVar55._8_4_ = fVar4 * *(float *)(uVar12 + 0x108);
          auVar55._12_4_ = fVar4 * *(float *)(uVar12 + 0x10c);
          auVar52 = ZEXT816(0) << 0x40;
          auVar38 = vfmadd231ps_fma(auVar38,auVar57,auVar52);
          auVar47 = vfmadd231ps_fma(auVar47,auVar57,auVar52);
          auVar52 = vfmadd231ps_fma(auVar55,auVar57,auVar52);
          auVar59._0_4_ = fVar4 * *(float *)(uVar12 + 0x110);
          auVar59._4_4_ = fVar4 * *(float *)(uVar12 + 0x114);
          auVar59._8_4_ = fVar4 * *(float *)(uVar12 + 0x118);
          auVar59._12_4_ = fVar4 * *(float *)(uVar12 + 0x11c);
          auVar61._0_4_ = fVar4 * *(float *)(uVar12 + 0x120);
          auVar61._4_4_ = fVar4 * *(float *)(uVar12 + 0x124);
          auVar61._8_4_ = fVar4 * *(float *)(uVar12 + 0x128);
          auVar61._12_4_ = fVar4 * *(float *)(uVar12 + 300);
          auVar39 = vaddps_avx512vl(auVar57,auVar59);
          auVar40 = vaddps_avx512vl(auVar57,auVar61);
          auVar62._0_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x130);
          auVar62._4_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x134);
          auVar62._8_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x138);
          auVar62._12_4_ = fVar5 + fVar4 * *(float *)(uVar12 + 0x13c);
          auVar60._0_4_ = fVar3 * auVar35._0_4_;
          auVar60._4_4_ = fVar3 * auVar35._4_4_;
          auVar60._8_4_ = fVar3 * auVar35._8_4_;
          auVar60._12_4_ = fVar3 * auVar35._12_4_;
          auVar56._0_4_ = fVar3 * auVar36._0_4_;
          auVar56._4_4_ = fVar3 * auVar36._4_4_;
          auVar56._8_4_ = fVar3 * auVar36._8_4_;
          auVar56._12_4_ = fVar3 * auVar36._12_4_;
          auVar58._0_4_ = fVar3 * auVar37._0_4_;
          auVar58._4_4_ = fVar3 * auVar37._4_4_;
          auVar58._8_4_ = fVar3 * auVar37._8_4_;
          auVar58._12_4_ = fVar3 * auVar37._12_4_;
          auVar43._4_4_ = uVar2;
          auVar43._0_4_ = uVar2;
          auVar43._8_4_ = uVar2;
          auVar43._12_4_ = uVar2;
          auVar41 = vfmadd231ps_avx512vl(auVar60,auVar43,*(undefined1 (*) [16])(uVar12 + 0x50));
          auVar42 = vfmadd231ps_avx512vl(auVar56,auVar43,*(undefined1 (*) [16])(uVar12 + 0x60));
          auVar43 = vfmadd231ps_avx512vl(auVar58,auVar43,*(undefined1 (*) [16])(uVar12 + 0x70));
          auVar44._4_4_ = uVar1;
          auVar44._0_4_ = uVar1;
          auVar44._8_4_ = uVar1;
          auVar44._12_4_ = uVar1;
          auVar41 = vfmadd231ps_avx512vl(auVar41,auVar44,*(undefined1 (*) [16])(uVar12 + 0x20));
          auVar42 = vfmadd231ps_avx512vl(auVar42,auVar44,*(undefined1 (*) [16])(uVar12 + 0x30));
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar44,*(undefined1 (*) [16])(uVar12 + 0x40));
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar45 = vandps_avx512vl(auVar41,auVar44);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          uVar19 = vcmpps_avx512vl(auVar45,auVar46,1);
          bVar7 = (bool)((byte)uVar19 & 1);
          iVar23 = auVar46._0_4_;
          auVar45._0_4_ = (uint)bVar7 * iVar23 | (uint)!bVar7 * auVar41._0_4_;
          bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
          iVar48 = auVar46._4_4_;
          auVar45._4_4_ = (uint)bVar7 * iVar48 | (uint)!bVar7 * auVar41._4_4_;
          bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
          iVar49 = auVar46._8_4_;
          iVar50 = auVar46._12_4_;
          auVar45._8_4_ = (uint)bVar7 * iVar49 | (uint)!bVar7 * auVar41._8_4_;
          bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar45._12_4_ = (uint)bVar7 * iVar50 | (uint)!bVar7 * auVar41._12_4_;
          auVar41 = vandps_avx512vl(auVar42,auVar44);
          uVar19 = vcmpps_avx512vl(auVar41,auVar46,1);
          bVar7 = (bool)((byte)uVar19 & 1);
          auVar41._0_4_ = (uint)bVar7 * iVar23 | (uint)!bVar7 * auVar42._0_4_;
          bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
          auVar41._4_4_ = (uint)bVar7 * iVar48 | (uint)!bVar7 * auVar42._4_4_;
          bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
          auVar41._8_4_ = (uint)bVar7 * iVar49 | (uint)!bVar7 * auVar42._8_4_;
          bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar41._12_4_ = (uint)bVar7 * iVar50 | (uint)!bVar7 * auVar42._12_4_;
          auVar44 = vandps_avx512vl(auVar43,auVar44);
          uVar19 = vcmpps_avx512vl(auVar44,auVar46,1);
          bVar7 = (bool)((byte)uVar19 & 1);
          auVar42._0_4_ = (uint)bVar7 * iVar23 | (uint)!bVar7 * auVar43._0_4_;
          bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar7 * iVar48 | (uint)!bVar7 * auVar43._4_4_;
          bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar7 * iVar49 | (uint)!bVar7 * auVar43._8_4_;
          bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar7 * iVar50 | (uint)!bVar7 * auVar43._12_4_;
          auVar43 = vrcp14ps_avx512vl(auVar45);
          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar45 = vfnmadd213ps_avx512vl(auVar45,auVar43,auVar44);
          auVar43 = vfmadd132ps_avx512vl(auVar45,auVar43,auVar43);
          auVar45 = vrcp14ps_avx512vl(auVar41);
          auVar41 = vfnmadd213ps_avx512vl(auVar41,auVar45,auVar44);
          auVar41 = vfmadd132ps_avx512vl(auVar41,auVar45,auVar45);
          auVar45 = vrcp14ps_avx512vl(auVar42);
          auVar44 = vfnmadd213ps_avx512vl(auVar42,auVar45,auVar44);
          auVar44 = vfmadd132ps_avx512vl(auVar44,auVar45,auVar45);
          auVar35 = vfmadd213ps_avx512vl(auVar35,auVar26,*(undefined1 (*) [16])(uVar12 + 0xb0));
          auVar36 = vfmadd213ps_avx512vl(auVar36,auVar26,*(undefined1 (*) [16])(uVar12 + 0xc0));
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar25,*(undefined1 (*) [16])(uVar12 + 0x50));
          auVar36 = vfmadd231ps_avx512vl(auVar36,auVar25,*(undefined1 (*) [16])(uVar12 + 0x60));
          auVar37 = vfmadd213ps_avx512vl(auVar37,auVar26,*(undefined1 (*) [16])(uVar12 + 0xd0));
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar25,*(undefined1 (*) [16])(uVar12 + 0x70));
          auVar42 = vfmadd231ps_avx512vl(auVar35,auVar24,*(undefined1 (*) [16])(uVar12 + 0x20));
          auVar45 = vfmadd231ps_avx512vl(auVar36,auVar24,*(undefined1 (*) [16])(uVar12 + 0x30));
          auVar46 = vfmadd231ps_avx512vl(auVar37,auVar24,*(undefined1 (*) [16])(uVar12 + 0x40));
          auVar35 = vsubps_avx(auVar38,auVar42);
          auVar39 = vsubps_avx512vl(auVar39,auVar42);
          auVar36 = vsubps_avx(auVar47,auVar45);
          auVar47 = vsubps_avx512vl(auVar40,auVar45);
          auVar37 = vsubps_avx(auVar52,auVar46);
          auVar38 = vsubps_avx(auVar62,auVar46);
          auVar46._0_4_ = auVar43._0_4_ * auVar35._0_4_;
          auVar46._4_4_ = auVar43._4_4_ * auVar35._4_4_;
          auVar46._8_4_ = auVar43._8_4_ * auVar35._8_4_;
          auVar46._12_4_ = auVar43._12_4_ * auVar35._12_4_;
          auVar40._0_4_ = auVar43._0_4_ * auVar39._0_4_;
          auVar40._4_4_ = auVar43._4_4_ * auVar39._4_4_;
          auVar40._8_4_ = auVar43._8_4_ * auVar39._8_4_;
          auVar40._12_4_ = auVar43._12_4_ * auVar39._12_4_;
          auVar53._0_4_ = auVar41._0_4_ * auVar36._0_4_;
          auVar53._4_4_ = auVar41._4_4_ * auVar36._4_4_;
          auVar53._8_4_ = auVar41._8_4_ * auVar36._8_4_;
          auVar53._12_4_ = auVar41._12_4_ * auVar36._12_4_;
          auVar54._0_4_ = auVar44._0_4_ * auVar37._0_4_;
          auVar54._4_4_ = auVar44._4_4_ * auVar37._4_4_;
          auVar54._8_4_ = auVar44._8_4_ * auVar37._8_4_;
          auVar54._12_4_ = auVar44._12_4_ * auVar37._12_4_;
          auVar39._0_4_ = auVar41._0_4_ * auVar47._0_4_;
          auVar39._4_4_ = auVar41._4_4_ * auVar47._4_4_;
          auVar39._8_4_ = auVar41._8_4_ * auVar47._8_4_;
          auVar39._12_4_ = auVar41._12_4_ * auVar47._12_4_;
          auVar52._0_4_ = auVar44._0_4_ * auVar38._0_4_;
          auVar52._4_4_ = auVar44._4_4_ * auVar38._4_4_;
          auVar52._8_4_ = auVar44._8_4_ * auVar38._8_4_;
          auVar52._12_4_ = auVar44._12_4_ * auVar38._12_4_;
          auVar35 = vpminsd_avx(auVar53,auVar39);
          auVar36 = vpminsd_avx(auVar54,auVar52);
          auVar35 = vmaxps_avx(auVar35,auVar36);
          auVar47 = vpminsd_avx(auVar46,auVar40);
          auVar37 = vpmaxsd_avx(auVar46,auVar40);
          auVar36 = vpmaxsd_avx(auVar53,auVar39);
          auVar38 = vpmaxsd_avx(auVar54,auVar52);
          auVar36 = vminps_avx(auVar36,auVar38);
          auVar38 = vmaxps_avx512vl(auVar33,auVar47);
          auVar35 = vmaxps_avx(auVar38,auVar35);
          auVar37 = vminps_avx512vl(auVar34,auVar37);
          auVar36 = vminps_avx(auVar37,auVar36);
          auVar37._8_4_ = 0x3f7ffffa;
          auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
          auVar37._12_4_ = 0x3f7ffffa;
          auVar37 = vmulps_avx512vl(auVar35,auVar37);
          auVar35._8_4_ = 0x3f800003;
          auVar35._0_8_ = 0x3f8000033f800003;
          auVar35._12_4_ = 0x3f800003;
          auVar35 = vmulps_avx512vl(auVar36,auVar35);
          uVar8 = vcmpps_avx512vl(auVar37,auVar35,2);
          bVar22 = (byte)uVar8;
        }
        else {
          auVar51._4_4_ = fVar4;
          auVar51._0_4_ = fVar4;
          auVar51._8_4_ = fVar4;
          auVar51._12_4_ = fVar4;
          auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar18),auVar51,
                                    *(undefined1 (*) [16])(uVar12 + 0x20 + uVar18));
          auVar35 = vsubps_avx512vl(auVar35,auVar24);
          auVar36 = vmulps_avx512vl(auVar27,auVar35);
          auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar15),auVar51,
                                    *(undefined1 (*) [16])(uVar12 + 0x20 + uVar15));
          auVar35 = vsubps_avx512vl(auVar35,auVar25);
          auVar37 = vmulps_avx512vl(auVar28,auVar35);
          auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar21),auVar51,
                                    *(undefined1 (*) [16])(uVar12 + 0x20 + uVar21));
          auVar35 = vsubps_avx512vl(auVar35,auVar26);
          auVar35 = vmulps_avx512vl(auVar29,auVar35);
          auVar35 = vmaxps_avx(auVar37,auVar35);
          auVar36 = vmaxps_avx512vl(auVar33,auVar36);
          auVar35 = vmaxps_avx(auVar36,auVar35);
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar18 ^ 0x10)),auVar51,
                                    *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar18 ^ 0x10)));
          auVar36 = vsubps_avx512vl(auVar36,auVar24);
          auVar37 = vmulps_avx512vl(auVar30,auVar36);
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar15 ^ 0x10)),auVar51,
                                    *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar15 ^ 0x10)));
          auVar36 = vsubps_avx512vl(auVar36,auVar25);
          auVar38 = vmulps_avx512vl(auVar31,auVar36);
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar21 ^ 0x10)),auVar51,
                                    *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar21 ^ 0x10)));
          auVar36 = vsubps_avx512vl(auVar36,auVar26);
          auVar36 = vmulps_avx512vl(auVar32,auVar36);
          auVar36 = vminps_avx(auVar38,auVar36);
          auVar37 = vminps_avx512vl(auVar34,auVar37);
          auVar36 = vminps_avx(auVar37,auVar36);
          uVar8 = vcmpps_avx512vl(auVar35,auVar36,2);
          bVar22 = (byte)uVar8;
          if (uVar13 == 6) {
            uVar8 = vcmpps_avx512vl(auVar51,*(undefined1 (*) [16])(uVar12 + 0xf0),1);
            uVar9 = vcmpps_avx512vl(auVar51,*(undefined1 (*) [16])(uVar12 + 0xe0),0xd);
            bVar22 = (byte)uVar8 & (byte)uVar9 & bVar22;
          }
        }
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar22);
      }
      if ((sVar20 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar13 = 4;
        }
        else {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          lVar14 = 0;
          for (uVar12 = unaff_RBP; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar13 = 0;
          for (uVar12 = unaff_RBP - 1 & unaff_RBP; sVar20 = *(size_t *)(uVar19 + lVar14 * 8),
              uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
            pNVar17->ptr = sVar20;
            pNVar17 = pNVar17 + 1;
            lVar14 = 0;
            for (uVar10 = uVar12; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
          }
        }
      }
      else {
        uVar13 = 6;
      }
    } while (uVar13 == 0);
    if (uVar13 == 6) {
      cVar11 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar20 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar13 = 0;
      if (cVar11 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar13 = 1;
      }
    }
  } while ((uVar13 & 3) == 0);
  return pNVar16 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }